

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O3

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetIntegralCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  pointer *ppLVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  LogicalType *left_type;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  pointer pEVar6;
  idx_t iVar7;
  uint64_t uVar8;
  idx_t iVar9;
  BoundConstantExpression *pBVar10;
  Optimizer *this_00;
  BaseStatistics *in_RCX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *arguments_00;
  hugeint_t value;
  hugeint_t value_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  Value result;
  Value min;
  Value max;
  Value range_value;
  ScalarFunction compress_function;
  BaseStatistics compress_stats;
  BoundConstantExpression *local_498;
  element_type *peStack_490;
  pointer local_488;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_480;
  LogicalType *local_478;
  pointer local_470 [3];
  undefined1 local_458 [64];
  undefined1 local_418 [96];
  Value local_3b8;
  ClientContext *local_378;
  LogicalType local_370;
  LogicalType local_358;
  Value local_340;
  undefined1 local_300 [16];
  _Alloc_hider _Stack_2f0;
  BaseScalarFunction local_2a8;
  undefined1 local_1f8 [16];
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_180 [24];
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_168;
  ScalarFunction local_158;
  
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)stats);
  iVar7 = GetTypeIdSize((pEVar6->return_type).physical_type_);
  if ((iVar7 == 1) || (bVar5 = NumericStats::HasMinMax(in_RCX), !bVar5)) {
    this->optimizer = (Optimizer *)0x0;
    return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
           )(unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
             )this;
  }
  _Var2._M_head_impl =
       input[1].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  NumericStats::Min((Value *)(local_418 + 0x20),in_RCX);
  NumericStats::Max(&local_3b8,in_RCX);
  bVar5 = Value::operator<(&local_3b8,(Value *)(local_418 + 0x20));
  local_478 = &pEVar6->return_type;
  if (bVar5) {
    value.upper = (int64_t)local_478;
    value.lower = 0x7fffffffffffffff;
    Value::HUGEINT(&local_340,(Value *)0xffffffffffffffff,value);
  }
  else {
    local_498 = (BoundConstantExpression *)0x0;
    peStack_490 = (element_type *)0x0;
    local_488 = (pointer)0x0;
    pBVar10 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_300,&local_3b8);
    local_378 = (ClientContext *)_Var2._M_head_impl;
    BoundConstantExpression::BoundConstantExpression(pBVar10,(Value *)local_300);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)pBVar10;
    Value::~Value((Value *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_498,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_158);
    if ((BoundConstantExpression *)
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundConstantExpression *)0x0) {
      (*(((Expression *)
         local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function)->
        super_BaseExpression)._vptr_BaseExpression[1])();
    }
    pBVar10 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_300,(Value *)(local_418 + 0x20));
    BoundConstantExpression::BoundConstantExpression(pBVar10,(Value *)local_300);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)pBVar10;
    Value::~Value((Value *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_498,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_158);
    if ((BoundConstantExpression *)
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundConstantExpression *)0x0) {
      (*(((Expression *)
         local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function)->
        super_BaseExpression)._vptr_BaseExpression[1])();
    }
    left_type = local_478;
    LogicalType::LogicalType((LogicalType *)local_470,local_478);
    SubtractFunction::GetFunction(&local_158,left_type,left_type);
    arguments_00 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_418;
    local_418._0_8_ = local_498;
    local_418._8_8_ = peStack_490;
    local_418._16_8_ = local_488;
    local_498 = (BoundConstantExpression *)0x0;
    peStack_490 = (element_type *)0x0;
    local_488 = (pointer)0x0;
    local_480._M_head_impl = (FunctionData *)0x0;
    BoundFunctionExpression::BoundFunctionExpression
              ((BoundFunctionExpression *)local_300,(LogicalType *)local_470,&local_158,arguments_00
               ,(unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *
                )&local_480,false);
    if (local_480._M_head_impl != (FunctionData *)0x0) {
      (*(local_480._M_head_impl)->_vptr_FunctionData[1])();
    }
    local_480._M_head_impl = (FunctionData *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_418);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_019684c8;
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_158.function.super__Function_base._M_manager)
                ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor
                );
    }
    BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
    LogicalType::~LogicalType((LogicalType *)local_470);
    LogicalType::LogicalType(&local_358,SQLNULL);
    Value::Value((Value *)local_458,&local_358);
    LogicalType::~LogicalType(&local_358);
    bVar5 = ExpressionExecutor::TryEvaluateScalar
                      (local_378,(Expression *)local_300,(Value *)local_458);
    if (bVar5) {
      Value::Value(&local_340,(Value *)local_458);
    }
    else {
      value_00.upper = (int64_t)arguments_00;
      value_00.lower = 0x7fffffffffffffff;
      Value::HUGEINT(&local_340,(Value *)0xffffffffffffffff,value_00);
    }
    Value::~Value((Value *)local_458);
    local_300._0_8_ = &PTR__BoundFunctionExpression_01981410;
    if (local_168._M_head_impl != (FunctionData *)0x0) {
      (*(local_168._M_head_impl)->_vptr_FunctionData[1])();
    }
    local_168._M_head_impl = (FunctionData *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(local_180);
    local_2a8.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_019684c8;
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
    if (local_1e8 != (element_type *)0x0) {
      (*(code *)local_1e8)(local_1f8,local_1f8,3);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_2a8);
    Expression::~Expression((Expression *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_498);
  }
  Value::~Value(&local_3b8);
  Value::~Value((Value *)(local_418 + 0x20));
  LogicalType::LogicalType((LogicalType *)local_300,UBIGINT);
  bVar5 = Value::DefaultTryCastAs(&local_340,(LogicalType *)local_300,false);
  LogicalType::~LogicalType((LogicalType *)local_300);
  if (!bVar5) {
    this->optimizer = (Optimizer *)0x0;
    goto LAB_00685f34;
  }
  uVar8 = UBigIntValue::Get(&local_340);
  LogicalType::LogicalType((LogicalType *)local_458);
  if (uVar8 < 0x100) {
    LogicalType::LogicalType((LogicalType *)local_300,UTINYINT);
LAB_00685bc0:
    uVar4 = local_458._16_8_;
    uVar3 = local_458._8_8_;
    local_458._0_2_ = local_300._0_2_;
    local_458._8_8_ = local_300._8_8_;
    local_458._16_8_ = _Stack_2f0._M_p;
    local_300._8_8_ = uVar3;
    _Stack_2f0._M_p = (pointer)uVar4;
  }
  else {
    if (uVar8 < 0x10000) {
      LogicalType::LogicalType((LogicalType *)local_300,USMALLINT);
      goto LAB_00685bc0;
    }
    if (uVar8 >> 0x20 == 0) {
      LogicalType::LogicalType((LogicalType *)local_300,UINTEGER);
    }
    else {
      LogicalType::LogicalType((LogicalType *)local_300,UBIGINT);
    }
    LogicalType::operator=((LogicalType *)local_458,(LogicalType *)local_300);
  }
  LogicalType::~LogicalType((LogicalType *)local_300);
  iVar7 = GetTypeIdSize(local_458[1]);
  iVar9 = GetTypeIdSize((pEVar6->return_type).physical_type_);
  if (iVar7 == iVar9) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    CMIntegralCompressFun::GetFunction
              ((ScalarFunction *)local_300,local_478,(LogicalType *)local_458);
    local_498 = (BoundConstantExpression *)0x0;
    peStack_490 = (element_type *)0x0;
    local_488 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_498,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               stats);
    NumericStats::Min((Value *)(local_418 + 0x20),in_RCX);
    pBVar10 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)&local_158,(Value *)(local_418 + 0x20));
    BoundConstantExpression::BoundConstantExpression(pBVar10,(Value *)&local_158);
    local_3b8.type_._0_8_ = pBVar10;
    Value::~Value((Value *)&local_158);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_498,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_3b8);
    if ((BoundConstantExpression *)local_3b8.type_._0_8_ != (BoundConstantExpression *)0x0) {
      (*(((Expression *)local_3b8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_3b8.type_._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Value::~Value((Value *)(local_418 + 0x20));
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)0x0;
    make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
              ((LogicalType *)local_470,(ScalarFunction *)local_458,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_300,&local_498);
    LogicalType::LogicalType(&local_370,(LogicalType *)local_458);
    BaseStatistics::CreateEmpty((BaseStatistics *)&local_158,&local_370);
    LogicalType::~LogicalType(&local_370);
    BaseStatistics::CopyBase((BaseStatistics *)&local_158,in_RCX);
    Value::Value(&local_3b8,0);
    Value::DefaultCastAs((Value *)(local_418 + 0x20),&local_3b8,(LogicalType *)local_458,false);
    NumericStats::SetMin((BaseStatistics *)&local_158,(Value *)(local_418 + 0x20));
    Value::~Value((Value *)(local_418 + 0x20));
    Value::~Value(&local_3b8);
    Value::DefaultCastAs((Value *)(local_418 + 0x20),&local_340,(LogicalType *)local_458,false);
    NumericStats::SetMax((BaseStatistics *)&local_158,(Value *)(local_418 + 0x20));
    Value::~Value((Value *)(local_418 + 0x20));
    BaseStatistics::ToUnique((BaseStatistics *)local_418);
    this_00 = (Optimizer *)operator_new(0x10);
    local_418._32_8_ = local_470[0];
    local_470[0] = (pointer)0x0;
    local_3b8.type_.id_ = local_418[0];
    local_3b8.type_.physical_type_ = local_418[1];
    local_3b8.type_._2_6_ = local_418._2_6_;
    local_418._0_8_ = (BoundConstantExpression *)0x0;
    CompressExpression::CompressExpression
              ((CompressExpression *)this_00,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_418 + 0x20),
               (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)&local_3b8);
    uVar3 = local_3b8.type_._0_8_;
    this->optimizer = this_00;
    if ((BoundConstantExpression *)local_3b8.type_._0_8_ != (BoundConstantExpression *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_3b8.type_._0_8_);
      operator_delete((void *)uVar3);
    }
    local_3b8.type_._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pointer)local_418._32_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_418._32_8_ + 8))();
    }
    uVar3 = local_418._0_8_;
    if ((BoundConstantExpression *)local_418._0_8_ != (BoundConstantExpression *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_418._0_8_);
      operator_delete((void *)uVar3);
    }
    BaseStatistics::~BaseStatistics((BaseStatistics *)&local_158);
    if (local_470[0] != (pointer)0x0) {
      (**(code **)(*(long *)&local_470[0]->id_ + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_498);
    local_300._0_8_ = &PTR__ScalarFunction_019684c8;
    if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
    }
    if (local_2a8.super_SimpleFunction.original_arguments.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      ppLVar1 = &local_2a8.super_SimpleFunction.arguments.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      (*(code *)local_2a8.super_SimpleFunction.original_arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish)(ppLVar1,ppLVar1,3);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_300);
  }
  LogicalType::~LogicalType((LogicalType *)local_458);
LAB_00685f34:
  Value::~Value(&local_340);
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetIntegralCompress(unique_ptr<Expression> input,
                                                                              const BaseStatistics &stats) {
	const auto &type = input->return_type;
	if (GetTypeIdSize(type.InternalType()) == 1 || !NumericStats::HasMinMax(stats)) {
		return nullptr;
	}

	// Get range and cast to UBIGINT (might fail for HUGEINT, in which case we just return)
	Value range_value = GetIntegralRangeValue(context, type, stats);
	if (!range_value.DefaultTryCastAs(LogicalType::UBIGINT)) {
		return nullptr;
	}

	// Get the smallest type that the range can fit into
	const auto range = UBigIntValue::Get(range_value);
	LogicalType cast_type;
	if (range <= NumericLimits<uint8_t>().Maximum()) {
		cast_type = LogicalType::UTINYINT;
	} else if (range <= NumericLimits<uint16_t>().Maximum()) {
		cast_type = LogicalType::USMALLINT;
	} else if (range <= NumericLimits<uint32_t>().Maximum()) {
		cast_type = LogicalType::UINTEGER;
	} else {
		D_ASSERT(range <= NumericLimits<uint64_t>().Maximum());
		cast_type = LogicalType::UBIGINT;
	}

	// Check if type that fits the range is smaller than the input type
	if (GetTypeIdSize(cast_type.InternalType()) == GetTypeIdSize(type.InternalType())) {
		return nullptr;
	}
	D_ASSERT(GetTypeIdSize(cast_type.InternalType()) < GetTypeIdSize(type.InternalType()));

	// Compressing will yield a benefit
	auto compress_function = CMIntegralCompressFun::GetFunction(type, cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	arguments.emplace_back(make_uniq<BoundConstantExpression>(NumericStats::Min(stats)));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	NumericStats::SetMin(compress_stats, Value(0).DefaultCastAs(cast_type));
	NumericStats::SetMax(compress_stats, range_value.DefaultCastAs(cast_type));

	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}